

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_5x10(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *wsptr;
  DCTELEM *dataptr;
  DCTELEM workspace [16];
  INT32 tmp14;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp4;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_c4;
  int *local_b8;
  int *local_b0;
  int local_a8 [8];
  int local_88 [14];
  long local_50;
  long local_48;
  long local_30;
  long local_28;
  long local_20;
  uint local_14;
  long local_10;
  int *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(in_RDI,0,0x100);
  local_b0 = local_8;
  local_c4 = 0;
  while( true ) {
    while( true ) {
      pbVar1 = (byte *)(*(long *)(local_10 + (long)local_c4 * 8) + (ulong)local_14);
      local_30 = (long)(int)(uint)pbVar1[2];
      local_48 = (long)(int)((uint)*pbVar1 + (uint)pbVar1[4]) +
                 (long)(int)((uint)pbVar1[1] + (uint)pbVar1[3]);
      local_50 = (long)(int)((uint)*pbVar1 + (uint)pbVar1[4]) -
                 (long)(int)((uint)pbVar1[1] + (uint)pbVar1[3]);
      local_20 = (long)(int)((uint)*pbVar1 - (uint)pbVar1[4]);
      local_28 = (long)(int)((uint)pbVar1[1] - (uint)pbVar1[3]);
      *local_b0 = ((int)local_48 + (uint)pbVar1[2] + -0x280) * 4;
      local_50 = local_50 * 0x194c;
      local_48 = (local_48 + local_30 * -4) * 0xb50;
      local_b0[2] = (int)(local_50 + local_48 + 0x400 >> 0xb);
      local_b0[4] = (int)((local_50 - local_48) + 0x400 >> 0xb);
      local_48 = (local_20 + local_28) * 0x1a9a;
      local_b0[1] = (int)(local_48 + local_20 * 0x1071 + 0x400 >> 0xb);
      local_b0[3] = (int)(local_48 + local_28 * -0x45a4 + 0x400 >> 0xb);
      local_c4 = local_c4 + 1;
      if (local_c4 != 8) break;
      local_b0 = local_a8;
    }
    if (local_c4 == 10) break;
    local_b0 = local_b0 + 8;
  }
  local_b0 = local_8;
  local_b8 = local_a8;
  for (local_c4 = 0; local_c4 < 5; local_c4 = local_c4 + 1) {
    lVar2 = (long)(local_b0[0x10] + local_b0[0x38]);
    lVar3 = (long)(*local_b0 + local_b8[8]) + (long)(local_b0[0x20] + local_b0[0x28]);
    lVar4 = (long)(*local_b0 + local_b8[8]) - (long)(local_b0[0x20] + local_b0[0x28]);
    lVar5 = (long)(local_b0[8] + *local_b8) + (long)(local_b0[0x18] + local_b0[0x30]);
    lVar6 = (long)(local_b0[8] + *local_b8) - (long)(local_b0[0x18] + local_b0[0x30]);
    lVar7 = (long)(*local_b0 - local_b8[8]);
    lVar8 = (long)(local_b0[8] - *local_b8);
    lVar9 = (long)(local_b0[0x10] - local_b0[0x38]);
    lVar10 = (long)(local_b0[0x18] - local_b0[0x30]);
    lVar11 = (long)(local_b0[0x20] - local_b0[0x28]);
    *local_b0 = (int)((lVar3 + lVar5 + lVar2) * 0x28f6 + 0x4000 >> 0xf);
    local_b0[0x20] =
         (int)((lVar3 + lVar2 * -2) * 0x2edd + (lVar5 + lVar2 * -2) * -0x11e6 + 0x4000 >> 0xf);
    lVar2 = (lVar4 + lVar6) * 0x220c;
    local_b0[0x10] = (int)(lVar2 + lVar4 * 0x150b + 0x4000 >> 0xf);
    local_b0[0x30] = (int)(lVar2 + lVar6 * -0x5924 + 0x4000 >> 0xf);
    lVar2 = lVar8 - lVar10;
    local_b0[0x28] = (int)((((lVar7 + lVar11) - lVar2) - lVar9) * 0x28f6 + 0x4000 >> 0xf);
    local_b0[8] = (int)(lVar7 * 0x3937 + lVar8 * 0x339d + lVar9 * 0x28f6 + lVar10 * 0x1a4c +
                        lVar11 * 0x910 + 0x4000 >> 0xf);
    lVar3 = (lVar7 - lVar11) * 0x26f5 + (lVar8 + lVar10) * -0x1813;
    lVar2 = (lVar7 + lVar11 + lVar2) * 0xca8 + lVar2 * 0x147b + lVar9 * -0x28f6;
    local_b0[0x18] = (int)(lVar3 + lVar2 + 0x4000 >> 0xf);
    local_b0[0x38] = (int)((lVar3 - lVar2) + 0x4000 >> 0xf);
    local_b0 = local_b0 + 1;
    local_b8 = local_b8 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_5x10 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14;
  DCTELEM workspace[8*2];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* 5-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/10). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[4]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[3]);
    tmp2 = GETJSAMPLE(elemptr[2]);

    tmp10 = tmp0 + tmp1;
    tmp11 = tmp0 - tmp1;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[4]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[3]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp2 - 5 * CENTERJSAMPLE) << PASS1_BITS);
    tmp11 = MULTIPLY(tmp11, FIX(0.790569415));          /* (c2+c4)/2 */
    tmp10 -= tmp2 << 2;
    tmp10 = MULTIPLY(tmp10, FIX(0.353553391));          /* (c2-c4)/2 */
    dataptr[2] = (DCTELEM) DESCALE(tmp11 + tmp10, CONST_BITS-PASS1_BITS);
    dataptr[4] = (DCTELEM) DESCALE(tmp11 - tmp10, CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp10 = MULTIPLY(tmp0 + tmp1, FIX(0.831253876));    /* c3 */

    dataptr[1] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp0, FIX(0.513743148)), /* c1-c3 */
	      CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp1, FIX(2.176250899)), /* c1+c3 */
	      CONST_BITS-PASS1_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 10)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/5)*(8/10) = 32/25, which we
   * fold into the constant multipliers:
   * 10-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/20) * 32/25.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = 0; ctr < 5; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*1];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*0];
    tmp12 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*7];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*6];
    tmp4 = dataptr[DCTSIZE*4] + dataptr[DCTSIZE*5];

    tmp10 = tmp0 + tmp4;
    tmp13 = tmp0 - tmp4;
    tmp11 = tmp1 + tmp3;
    tmp14 = tmp1 - tmp3;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*1];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*0];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*7];
    tmp3 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*6];
    tmp4 = dataptr[DCTSIZE*4] - dataptr[DCTSIZE*5];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11 + tmp12, FIX(1.28)), /* 32/25 */
	      CONST_BITS+PASS1_BITS);
    tmp12 += tmp12;
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.464477191)) - /* c4 */
	      MULTIPLY(tmp11 - tmp12, FIX(0.559380511)),  /* c8 */
	      CONST_BITS+PASS1_BITS);
    tmp10 = MULTIPLY(tmp13 + tmp14, FIX(1.064004961));    /* c6 */
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp13, FIX(0.657591230)),  /* c2-c6 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(2.785601151)),  /* c2+c6 */
	      CONST_BITS+PASS1_BITS);

    /* Odd part */

    tmp10 = tmp0 + tmp4;
    tmp11 = tmp1 - tmp3;
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp11 - tmp2, FIX(1.28)),  /* 32/25 */
	      CONST_BITS+PASS1_BITS);
    tmp2 = MULTIPLY(tmp2, FIX(1.28));                     /* 32/25 */
    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.787906876)) +          /* c1 */
	      MULTIPLY(tmp1, FIX(1.612894094)) + tmp2 +   /* c3 */
	      MULTIPLY(tmp3, FIX(0.821810588)) +          /* c7 */
	      MULTIPLY(tmp4, FIX(0.283176630)),           /* c9 */
	      CONST_BITS+PASS1_BITS);
    tmp12 = MULTIPLY(tmp0 - tmp4, FIX(1.217352341)) -     /* (c3+c7)/2 */
	    MULTIPLY(tmp1 + tmp3, FIX(0.752365123));      /* (c1-c9)/2 */
    tmp13 = MULTIPLY(tmp10 + tmp11, FIX(0.395541753)) +   /* (c3-c7)/2 */
	    MULTIPLY(tmp11, FIX(0.64)) - tmp2;            /* 16/25 */
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp12 + tmp13, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp12 - tmp13, CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}